

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::Generate
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *field;
  Context *pCVar1;
  pointer pcVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  string_view begin_varname;
  string_view text;
  string_view text_00;
  string_view end_varname;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  undefined1 local_90 [8];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined2 local_48;
  LogMessageFatal local_40;
  
  local_b8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_b8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_b8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  ExtensionGenerator::InitTemplateVars
            (this->descriptor_,&this->scope_,true,this->name_resolver_,
             (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_b8,this->context_);
  text._M_str = "public static final int $constant_name$ = $number$;\n";
  text._M_len = 0x34;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_b8,text);
  field = this->descriptor_;
  pCVar1 = this->context_;
  local_90[4] = (pCVar1->options_).opensource_runtime;
  local_90[5] = (pCVar1->options_).annotate_code;
  local_90[0] = (pCVar1->options_).generate_immutable_code;
  local_90[1] = (pCVar1->options_).generate_mutable_code;
  local_90[2] = (pCVar1->options_).generate_shared_code;
  local_90[3] = (pCVar1->options_).enforce_lite;
  pcVar2 = (pCVar1->options_).annotation_list_file._M_dataplus._M_p;
  local_88._M_p = (pointer)&local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,
             pcVar2 + (pCVar1->options_).annotation_list_file._M_string_length);
  pcVar2 = (pCVar1->options_).output_list_file._M_dataplus._M_p;
  local_68._M_p = (pointer)&local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,
             pcVar2 + (pCVar1->options_).output_list_file._M_string_length);
  local_48._0_1_ = (pCVar1->options_).strip_nonfunctional_codegen;
  local_48._1_1_ = (pCVar1->options_).jvm_dsl;
  WriteFieldDocComment(printer,field,(Options *)local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_p != &local_78) {
    operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
  }
  if ((this->descriptor_->field_0x1 & 8) != 0) {
    bVar5 = (this->descriptor_->scope_).containing_oneof == (OneofDescriptor *)0x0;
    sVar4 = 0x131;
    if (bVar5) {
      sVar4 = 0xfb;
    }
    pcVar3 = 
    "public static final\n  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessage\n        .newMessageScopedGeneratedExtension(\n      $scope$.getDefaultInstance(),\n      $index$,\n      $singular_type$.class,\n      $prototype$);\n"
    ;
    if (bVar5) {
      pcVar3 = 
      "public static final\n  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessage\n        .newFileScopedGeneratedExtension(\n      $singular_type$.class,\n      $prototype$);\n"
      ;
    }
    text_00._M_str = pcVar3;
    text_00._M_len = sVar4;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_b8,text_00);
    begin_varname._M_str = "name";
    begin_varname._M_len = 4;
    end_varname._M_str = "name";
    end_varname._M_len = 4;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,this->descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~raw_hash_set(&local_b8);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb3d,"is_extension_");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

void ImmutableExtensionGenerator::Generate(io::Printer* printer) {
  absl::flat_hash_map<absl::string_view, std::string> vars;
  const bool kUseImmutableNames = true;
  InitTemplateVars(descriptor_, scope_, kUseImmutableNames, name_resolver_,
                   &vars, context_);
  printer->Print(vars, "public static final int $constant_name$ = $number$;\n");

  WriteFieldDocComment(printer, descriptor_, context_->options());
  if (descriptor_->extension_scope() == nullptr) {
    // Non-nested
    printer->Print(
        vars,
        "public static final\n"
        "  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
        "    $containing_type$,\n"
        "    $type$> $name$ = com.google.protobuf.GeneratedMessage\n"
        "        .newFileScopedGeneratedExtension(\n"
        "      $singular_type$.class,\n"
        "      $prototype$);\n");
  } else {
    // Nested
    printer->Print(
        vars,
        "public static final\n"
        "  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
        "    $containing_type$,\n"
        "    $type$> $name$ = com.google.protobuf.GeneratedMessage\n"
        "        .newMessageScopedGeneratedExtension(\n"
        "      $scope$.getDefaultInstance(),\n"
        "      $index$,\n"
        "      $singular_type$.class,\n"
        "      $prototype$);\n");
  }
  printer->Annotate("name", descriptor_);
}